

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall_link.c
# Opt level: O1

void * metacall_link_hook(void *handle,char *symbol)

{
  _func_void *UNRECOVERED_JUMPTABLE;
  set_value pvVar1;
  void *pvVar2;
  
  threading_mutex_lock(&link_mutex);
  UNRECOVERED_JUMPTABLE = detour_trampoline(detour_link_handle);
  pvVar1 = set_get(metacall_link_table,symbol);
  threading_mutex_unlock(&link_mutex);
  if (pvVar1 != (set_value)0x0) {
    return pvVar1;
  }
  pvVar2 = (void *)(*UNRECOVERED_JUMPTABLE)(handle,symbol);
  return pvVar2;
}

Assistant:

void *metacall_link_hook(void *handle, const char *symbol)
{
	typedef void *(*metacall_link_func_ptr)(void *, const char *);

	metacall_link_func_ptr metacall_link_trampoline;

	void *ptr;

	threading_mutex_lock(&link_mutex);

	metacall_link_trampoline = (metacall_link_func_ptr)detour_trampoline(detour_link_handle);

	/* Intercept function if any */
	ptr = set_get(metacall_link_table, (set_key)symbol);

	/* TODO: Disable logs here until log is completely thread safe and async signal safe */
	/* log_write("metacall", LOG_LEVEL_DEBUG, "MetaCall detour link interception: %s -> %p", symbol, ptr); */

	threading_mutex_unlock(&link_mutex);

	if (ptr != NULL)
	{
		return ptr;
	}

	return metacall_link_trampoline(handle, symbol);
}